

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

Gia_Man_t * Abc_NtkHieCecTest2(char *pFileName,char *pModelName,int fVerbose)

{
  abctime aVar1;
  Au_Ntk_t *p;
  abctime aVar2;
  Au_Ntk_t *pAVar3;
  Gia_Man_t *pGVar4;
  abctime aVar5;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Au_Ntk_t *pNtk;
  
  aVar1 = Abc_Clock();
  p = Au_NtkParseCBlif(pFileName);
  if (p == (Au_Ntk_t *)0x0) {
    puts("Reading CBLIF file has failed.");
  }
  else {
    if ((p->pMan != (Au_Man_t *)0x0) && ((p->pMan->vNtks).pArray != (void **)0x0)) {
      aVar2 = Abc_Clock();
      Abc_PrintTime(0x676917,(char *)(aVar2 - aVar1),CONCAT44(extraout_var,extraout_EDX));
      if (fVerbose != 0) {
        Au_ManPrintBoxInfo(p);
        Au_ManPrintStats(p->pMan);
      }
      Au_ManCountThings(p->pMan);
      if (pModelName == (char *)0x0) {
        pAVar3 = (Au_Ntk_t *)0x0;
      }
      else {
        pAVar3 = Au_ManFindNtkP(p->pMan,pModelName);
      }
      pNtk = p;
      if (pAVar3 != (Au_Ntk_t *)0x0) {
        pNtk = pAVar3;
      }
      Au_NtkCheckRecursive(pNtk);
      aVar2 = Abc_Clock();
      pGVar4 = Au_NtkDeriveFlatGia(pNtk);
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x677b44,(char *)(aVar5 - aVar2),CONCAT44(extraout_var_00,extraout_EDX_00));
      Au_ManDelete(p->pMan);
      aVar2 = Abc_Clock();
      Abc_PrintTime(0x677b30,(char *)(aVar2 - aVar1),CONCAT44(extraout_var_01,extraout_EDX_01));
      return pGVar4;
    }
    puts("There is no hierarchy information.");
    Au_NtkFree(p);
  }
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Abc_NtkHieCecTest2( char * pFileName, char * pModelName, int fVerbose )
{
    int fSimulation = 0;
    Gia_Man_t * pGia = NULL;
    Au_Ntk_t * pNtk, * pNtkClp = NULL;
    abctime clk1 = 0, clk = Abc_Clock();

    // read hierarchical netlist
    pNtk = Au_NtkParseCBlif( pFileName );
    if ( pNtk == NULL )
    {
        printf( "Reading CBLIF file has failed.\n" );
        return NULL;
    }
    if ( pNtk->pMan == NULL || pNtk->pMan->vNtks.pArray == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        Au_NtkFree( pNtk );
        return NULL;
    }
    Abc_PrintTime( 1, "Reading file", Abc_Clock() - clk );

    if ( fVerbose )
    {
        Au_ManPrintBoxInfo( pNtk );
//    Au_ManPrintBoxInfoSorted( pNtk );
        Au_ManPrintStats( pNtk->pMan );
    }
    Au_ManCountThings( pNtk->pMan );

    // select network
    if ( pModelName )
        pNtkClp = Au_ManFindNtkP( pNtk->pMan, pModelName );
    if ( pNtkClp == NULL )
        pNtkClp = pNtk;

    // check if the model is recursive
    Au_NtkCheckRecursive( pNtkClp );

    // collapse
    clk1 = Abc_Clock();
    if ( fSimulation )
    {
        Au_NtkTerSimulate( pNtkClp );
        Abc_PrintTime( 1, "Time sim ", Abc_Clock() - clk1 );
    }
    else
    {
        pGia = Au_NtkDeriveFlatGia( pNtkClp );
        Abc_PrintTime( 1, "Time GIA ", Abc_Clock() - clk1 );
    }

    // delete
    Au_ManDelete( pNtk->pMan );
    Abc_PrintTime( 1, "Time all ", Abc_Clock() - clk );
    return pGia;
}